

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decompression.cpp
# Opt level: O3

bool __thiscall
Compressor::encodeHeaderlessChunk
          (Compressor *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *output,
          Image *input,Type type,bool isSwitch)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  Impl *pIVar3;
  uint __val;
  Image *image;
  iterator __begin1;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar4;
  pointer pCVar5;
  runtime_error *this_00;
  undefined7 in_register_00000081;
  bool bVar6;
  DefaultEncode enc;
  int p2;
  int p1;
  DefaultEncode local_99;
  string local_98;
  Image local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78.size.width = 0;
  local_78.size.height = 0;
  local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  image = input;
  if ((int)CONCAT71(in_register_00000081,isSwitch) == 0) {
    local_78.size = input->size;
    std::vector<Color,_std::allocator<Color>_>::operator=(&local_78.colorData,&input->colorData);
    for (pCVar5 = local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                  super__Vector_impl_data._M_start; image = &local_78,
        pCVar5 != local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                  super__Vector_impl_data._M_finish; pCVar5 = pCVar5 + 1) {
      uVar1 = pCVar5->b;
      pCVar5->b = pCVar5->r;
      pCVar5->r = uVar1;
    }
  }
  if (type < TYPE_INDEXED_ALPHA) {
    prepareWriteRGB(&this->impl->scratch,image);
    pIVar3 = this->impl;
    puVar2 = (pIVar3->scratch).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    local_50._M_dataplus._M_p._0_4_ = CONCAT31(local_50._M_dataplus._M_p._1_3_,isSwitch);
    LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
              (&pIVar3->compressor,output,puVar2,
               *(int *)&(pIVar3->scratch).
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_finish - (int)puVar2,(DefaultEncode *)&local_50);
    bVar6 = true;
  }
  else {
    __val = (uint)type;
    if (__val == 2) {
      Impl::getPalettes(this->impl,input,(int *)&local_50,(int *)&local_98);
      bVar6 = -1 < (int)local_98._M_dataplus._M_p;
      if (bVar6) {
        pvVar4 = Impl::writePaletted(this->impl,image,&this->impl->palette2,true);
        puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        local_99.isSwitch = isSwitch;
        LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
                  (&this->impl->compressor,output,puVar2,
                   *(int *)&(pvVar4->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (int)puVar2,&local_99);
      }
    }
    else {
      if (__val != 3) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::__cxx11::to_string(&local_98,__val);
        std::operator+(&local_50,"Unexpected type ",&local_98);
        std::runtime_error::runtime_error(this_00,(string *)&local_50);
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      Impl::getPalettes(this->impl,input,(int *)&local_50,(int *)&local_98);
      bVar6 = -1 < (int)local_50._M_dataplus._M_p;
      if (bVar6) {
        pvVar4 = Impl::writePaletted(this->impl,image,&this->impl->palette1,false);
        puVar2 = (pvVar4->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        local_99.isSwitch = isSwitch;
        LZ77Compressor::compress<LZ77Compressor::DefaultEncode&>
                  (&this->impl->compressor,output,puVar2,
                   *(int *)&(pvVar4->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish - (int)puVar2,&local_99);
      }
    }
  }
  if (local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.colorData.super__Vector_base<Color,_std::allocator<Color>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return bVar6;
}

Assistant:

bool Compressor::encodeHeaderlessChunk(std::vector<uint8_t>& output, const Image& input, ChunkHeader::Type type, bool isSwitch) {
	Image _local;
	const Image& local = isSwitch ? input : _local;
	if (!isSwitch) {
		_local = input;
		swapBR(_local);
	}
	switch (type) {
		case ChunkHeader::TYPE_COLOR:
		case ChunkHeader::TYPE_COLOR1:
			prepareWriteRGB(impl->scratch, local);
			compress(output, impl->scratch.data(), impl->scratch.size(), isSwitch);
			return true;

		case ChunkHeader::TYPE_INDEXED: {
			int p1, p2;
			impl->getPalettes(input, p1, p2);
			if (p1 < 0) { return false; }
			auto& img = impl->writePaletted(local, impl->palette1, false);
			compress(output, img.data(), img.size(), isSwitch);
			return true;
		}

		case ChunkHeader::TYPE_INDEXED_ALPHA: {
			int p1, p2;
			impl->getPalettes(input, p1, p2);
			if (p2 < 0) { return false; }
			auto& img = impl->writePaletted(local, impl->palette2, true);
			compress(output, img.data(), img.size(), isSwitch);
			return true;
		}
	}
	throw std::runtime_error("Unexpected type " + std::to_string(type));
}